

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

double __thiscall re2::trunc_abi_cxx11_(re2 *this,double __x)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  const_pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong uVar7;
  size_type sVar8;
  StringPiece *in_RSI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar10;
  StringPiece SVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  uVar7 = in_RSI->size_;
  if (uVar7 < 100) {
    pcVar4 = in_RSI->data_;
    if (pcVar4 == (const_pointer)0x0) {
      uVar7 = 0;
    }
    *(re2 **)this = this + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(SUB84(__x,0),this,pcVar4,pcVar4 + uVar7);
    return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  }
  SVar11 = StringPiece::substr(in_RSI,0,100);
  sVar8 = SVar11.size_;
  pcVar4 = SVar11.data_;
  if (pcVar4 == (const_pointer)0x0) {
    sVar8 = 0;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar4,pcVar4 + sVar8);
  pbVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append(&local_38,"...");
  *(re2 **)this = this + 0x10;
  pcVar1 = (pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar6) {
    uVar9 = *(undefined4 *)paVar6;
    uVar10 = *(undefined4 *)((long)&pbVar5->field_2 + 4);
    uVar2 = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    uVar3 = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
    *(undefined4 *)(this + 0x10) = uVar9;
    *(undefined4 *)(this + 0x14) = uVar10;
    *(undefined4 *)(this + 0x18) = uVar2;
    *(undefined4 *)(this + 0x1c) = uVar3;
  }
  else {
    *(pointer *)this = pcVar1;
    *(size_type *)(this + 0x10) = paVar6->_M_allocated_capacity;
    uVar9 = extraout_XMM0_Da_00;
    uVar10 = extraout_XMM0_Db_00;
  }
  *(size_type *)(this + 8) = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    uVar9 = extraout_XMM0_Da_01;
    uVar10 = extraout_XMM0_Db_01;
  }
  return (double)CONCAT44(uVar10,uVar9);
}

Assistant:

static std::string trunc(const StringPiece& pattern) {
  if (pattern.size() < 100)
    return std::string(pattern);
  return std::string(pattern.substr(0, 100)) + "...";
}